

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

double ZopfliCalculateBlockSize(ZopfliLZ77Store *lz77,size_t lstart,size_t lend,int btype)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint d_lengths [32];
  size_t d_counts [32];
  uint ll_lengths [288];
  size_t ll_counts [288];
  uint local_f28 [32];
  size_t local_ea8 [32];
  uint local_da8 [288];
  size_t local_928 [288];
  
  if (btype == 1) {
    GetFixedTree(local_da8,local_f28);
    if (lend < lstart + 0x360) {
      sVar2 = CalculateBlockSymbolSizeSmall(local_da8,local_f28,lz77,lstart,lend);
    }
    else {
      ZopfliLZ77GetHistogram(lz77,lstart,lend,local_928,local_ea8);
      sVar2 = CalculateBlockSymbolSizeGivenCounts
                        (local_928,local_ea8,local_da8,local_f28,lz77,lstart,lend);
    }
    auVar5._8_4_ = (int)(sVar2 >> 0x20);
    auVar5._0_8_ = sVar2;
    auVar5._12_4_ = 0x45300000;
    dVar3 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  }
  else {
    if (btype == 0) {
      sVar2 = ZopfliLZ77GetByteRange(lz77,lstart,lend);
      lVar1 = sVar2 * 8 +
              ((ulong)(0x1000100010001 < sVar2 * -0x1000100010001) + sVar2 / 0xffff) * 0x28;
      auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar4._0_8_ = lVar1;
      auVar4._12_4_ = 0x45300000;
      return (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    }
    dVar3 = GetDynamicLengths(lz77,lstart,lend,local_da8,local_f28);
  }
  return dVar3 + 3.0;
}

Assistant:

double ZopfliCalculateBlockSize(const ZopfliLZ77Store* lz77,
                                size_t lstart, size_t lend, int btype) {
  unsigned ll_lengths[ZOPFLI_NUM_LL];
  unsigned d_lengths[ZOPFLI_NUM_D];

  double result = 3; /* bfinal and btype bits */

  if (btype == 0) {
    size_t length = ZopfliLZ77GetByteRange(lz77, lstart, lend);
    size_t rem = length % 65535;
    size_t blocks = length / 65535 + (rem ? 1 : 0);
    /* An uncompressed block must actually be split into multiple blocks if it's
       larger than 65535 bytes long. Eeach block header is 5 bytes: 3 bits,
       padding, LEN and NLEN (potential less padding for first one ignored). */
    return blocks * 5 * 8 + length * 8;
  } if (btype == 1) {
    GetFixedTree(ll_lengths, d_lengths);
    result += CalculateBlockSymbolSize(
        ll_lengths, d_lengths, lz77, lstart, lend);
  } else {
    result += GetDynamicLengths(lz77, lstart, lend, ll_lengths, d_lengths);
  }

  return result;
}